

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpprotocolhandler.cpp
# Opt level: O1

bool __thiscall QHttpProtocolHandler::sendRequest(QHttpProtocolHandler *this)

{
  qint64 *pqVar1;
  ChannelState CVar2;
  QHttpNetworkConnectionChannel *pQVar3;
  QHttpNetworkReply *pQVar4;
  QHttpNetworkReplyPrivate *this_00;
  QObject *pQVar5;
  Data *pDVar6;
  QHttpNetworkRequestPrivate *pQVar7;
  QHttpNetworkConnectionPrivate *this_01;
  qsizetype qVar8;
  QIODevice *pQVar9;
  Data *pDVar10;
  int *piVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  byte bVar15;
  int iVar16;
  ProxyType PVar17;
  longlong __old_val_2;
  QSslSocket *this_02;
  long lVar18;
  long lVar19;
  char *pcVar20;
  QDebug *pQVar21;
  Data *pDVar22;
  QNonContiguousByteDevice *pQVar23;
  qint64 qVar24;
  qint64 headerSize;
  QArrayData *pQVar25;
  QString *url_00;
  QSharedDataPointer<QHttpNetworkRequestPrivate> *this_03;
  QAuthenticator *this_04;
  long in_FS_OFFSET;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  qint64 currentReadSize;
  QUrl url;
  QByteArray __old_val;
  QObject local_c8 [8];
  QString local_c0;
  QArrayData *local_a8;
  storage_type_conflict *local_a0;
  long local_98;
  QDebug local_90 [2];
  long local_80;
  QString local_78;
  undefined1 local_60 [12];
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->super_QAbstractProtocolHandler).m_channel;
  pQVar4 = pQVar3->reply;
  (this->super_QAbstractProtocolHandler).m_reply = pQVar4;
  if (pQVar4 == (QHttpNetworkReply *)0x0) {
    sendRequest();
LAB_00211392:
    bVar13 = false;
    goto LAB_00211394;
  }
  CVar2 = pQVar3->state;
  bVar13 = true;
  if (CVar2 == WaitingState) {
    pQVar23 = QHttpNetworkRequest::uploadByteDevice(&pQVar3->request);
    if (pQVar23 != (QNonContiguousByteDevice *)0x0) {
      QObject::disconnect((QObject *)pQVar23,"2readyRead()",
                          &((this->super_QAbstractProtocolHandler).m_channel)->super_QObject,
                          "1_q_uploadDataReadyRead()");
    }
    lVar18 = (**(code **)(*(long *)(this->super_QAbstractProtocolHandler).m_socket + 0xa0))();
    if (lVar18 != 0) {
      local_60._8_4_ = 0;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_48 = 0;
      uStack_44 = 0;
      QMetaObject::invokeMethodImpl
                (&((this->super_QAbstractProtocolHandler).m_channel)->super_QObject,
                 "_q_receiveReply",QueuedConnection,1,(void **)(local_60 + 8),(char **)&uStack_50,
                 (QMetaTypeInterface **)&local_48);
    }
    goto LAB_00211394;
  }
  if (CVar2 == WritingState) {
    pQVar23 = QHttpNetworkRequest::uploadByteDevice(&pQVar3->request);
    if ((pQVar23 != (QNonContiguousByteDevice *)0x0) &&
       (pQVar3 = (this->super_QAbstractProtocolHandler).m_channel,
       pQVar3->bytesTotal != pQVar3->written)) {
      this_02 = (QSslSocket *)QMetaObject::cast((QObject *)&QSslSocket::staticMetaObject);
      do {
        bVar13 = true;
        lVar18 = (**(code **)(*(long *)(this->super_QAbstractProtocolHandler).m_socket + 0xa8))();
        if (this_02 == (QSslSocket *)0x0) {
          lVar19 = 0;
        }
        else {
          lVar19 = QSslSocket::encryptedBytesToWrite(this_02);
        }
        if ((0x8000 < lVar19 + lVar18) ||
           (pQVar3 = (this->super_QAbstractProtocolHandler).m_channel,
           lVar18 = pQVar3->bytesTotal - pQVar3->written, lVar18 == 0)) goto LAB_00211394;
        local_78.d.d = (Data *)0x0;
        if (0x3fff < lVar18) {
          lVar18 = 0x4000;
        }
        pcVar20 = (char *)(**(code **)(*(long *)pQVar23 + 0x60))(pQVar23,lVar18,&local_78);
        if (&(local_78.d.d)->super_QArrayData == (QArrayData *)0xffffffffffffffff) {
LAB_00211279:
          QHttpNetworkConnectionPrivate::emitReplyError
                    (*(QHttpNetworkConnectionPrivate **)
                      &((this->super_QAbstractProtocolHandler).m_connection)->field_0x8,
                     (this->super_QAbstractProtocolHandler).m_socket,
                     (this->super_QAbstractProtocolHandler).m_reply,UnknownNetworkError);
          iVar16 = 1;
        }
        else {
          iVar16 = 4;
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0 && pcVar20 != (char *)0x0) {
            lVar18 = ((this->super_QAbstractProtocolHandler).m_channel)->written;
            lVar19 = (**(code **)(*(long *)pQVar23 + 0x78))(pQVar23);
            if (lVar18 == lVar19) {
              lVar18 = (this->m_header).d.size;
              if (lVar18 == 0) {
                pQVar25 = (QArrayData *)
                          QIODevice::write((char *)(this->super_QAbstractProtocolHandler).m_socket,
                                           (longlong)pcVar20);
              }
              else {
                QByteArray::append(&this->m_header,pcVar20,(qsizetype)local_78.d.d);
                pQVar9 = (this->super_QAbstractProtocolHandler).m_socket;
                pDVar10 = (this->m_header).d.d;
                pcVar20 = (this->m_header).d.ptr;
                (this->m_header).d.d = (Data *)0x0;
                (this->m_header).d.ptr = (char *)0x0;
                local_60._8_4_ = SUB84(pDVar10,0);
                uStack_54 = (undefined4)((ulong)pDVar10 >> 0x20);
                uStack_50 = SUB84(pcVar20,0);
                uStack_4c = (undefined4)((ulong)pcVar20 >> 0x20);
                qVar8 = (this->m_header).d.size;
                (this->m_header).d.size = 0;
                local_48 = (undefined4)qVar8;
                uStack_44 = (undefined4)((ulong)qVar8 >> 0x20);
                (this->m_header).d.size = 0;
                (this->m_header).d.d = (Data *)0x0;
                (this->m_header).d.ptr = (char *)0x0;
                lVar19 = QIODevice::write((QByteArray *)pQVar9);
                piVar11 = (int *)CONCAT44(uStack_54,local_60._8_4_);
                if (piVar11 != (int *)0x0) {
                  LOCK();
                  *piVar11 = *piVar11 + -1;
                  UNLOCK();
                  if (*piVar11 == 0) {
                    QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_60._8_4_),1,0x10);
                  }
                }
                pQVar25 = (QArrayData *)(lVar19 - lVar18);
                if (lVar19 == -1) {
                  pQVar25 = (QArrayData *)0xffffffffffffffff;
                }
                local_60._8_4_ = 0;
                uStack_54 = 0;
                uStack_50 = 0;
                uStack_4c = 0;
                local_48 = 0;
                uStack_44 = 0;
                QMetaObject::invokeMethodImpl
                          (&((this->super_QAbstractProtocolHandler).m_reply)->super_QObject,
                           "requestSent",QueuedConnection,1,(void **)(local_60 + 8),
                           (char **)&uStack_50,(QMetaTypeInterface **)&local_48);
              }
              if ((pQVar25 == (QArrayData *)0xffffffffffffffff) ||
                 (pQVar25 != &(local_78.d.d)->super_QArrayData)) goto LAB_00211279;
              pqVar1 = &((this->super_QAbstractProtocolHandler).m_channel)->written;
              *pqVar1 = (long)&(pQVar25->ref_)._q_value.super___atomic_base<int>._M_i + *pqVar1;
              (**(code **)(*(long *)pQVar23 + 0x68))(pQVar23,pQVar25);
              pQVar3 = (this->super_QAbstractProtocolHandler).m_channel;
              QHttpNetworkReply::dataSendProgress
                        ((QHttpNetworkReply *)(this->super_QAbstractProtocolHandler).m_reply,
                         pQVar3->written,pQVar3->bytesTotal);
              pQVar3 = (this->super_QAbstractProtocolHandler).m_channel;
              iVar16 = 0;
              if (pQVar3->written == pQVar3->bytesTotal) {
                pQVar3->state = WaitingState;
                (*(this->super_QAbstractProtocolHandler)._vptr_QAbstractProtocolHandler[4])(this);
                iVar16 = 4;
              }
            }
            else {
              local_60._8_4_ = 2;
              uStack_54 = 0;
              uStack_50 = 0;
              uStack_4c = 0;
              local_48 = 0;
              uStack_44 = 0;
              local_40 = "default";
              QMessageLogger::warning();
              pQVar21 = QDebug::operator<<(local_90,
                                           "QHttpProtocolHandler: Internal error in sendRequest. Expected to write at position"
                                          );
              pQVar21 = QDebug::operator<<(pQVar21,((this->super_QAbstractProtocolHandler).m_channel
                                                   )->written);
              pQVar21 = QDebug::operator<<(pQVar21,"but read device is at");
              qVar24 = (**(code **)(*(long *)pQVar23 + 0x78))(pQVar23);
              QDebug::operator<<(pQVar21,qVar24);
              QDebug::~QDebug(local_90);
              QHttpNetworkConnectionPrivate::emitReplyError
                        (*(QHttpNetworkConnectionPrivate **)
                          &((this->super_QAbstractProtocolHandler).m_connection)->field_0x8,
                         (this->super_QAbstractProtocolHandler).m_socket,
                         (this->super_QAbstractProtocolHandler).m_reply,ProtocolFailure);
              iVar16 = 1;
            }
          }
        }
        bVar13 = true;
      } while (iVar16 == 0);
      if (iVar16 == 4) goto LAB_00211394;
      goto LAB_00211392;
    }
    lVar18 = (this->m_header).d.size;
    if (lVar18 != 0) {
      pQVar9 = (this->super_QAbstractProtocolHandler).m_socket;
      pDVar10 = (this->m_header).d.d;
      pcVar20 = (this->m_header).d.ptr;
      (this->m_header).d.d = (Data *)0x0;
      (this->m_header).d.ptr = (char *)0x0;
      local_60._8_4_ = SUB84(pDVar10,0);
      uStack_54 = (undefined4)((ulong)pDVar10 >> 0x20);
      uStack_50 = SUB84(pcVar20,0);
      uStack_4c = (undefined4)((ulong)pcVar20 >> 0x20);
      (this->m_header).d.size = 0;
      local_48 = (undefined4)lVar18;
      uStack_44 = (undefined4)((ulong)lVar18 >> 0x20);
      (this->m_header).d.size = 0;
      (this->m_header).d.d = (Data *)0x0;
      (this->m_header).d.ptr = (char *)0x0;
      QIODevice::write((QByteArray *)pQVar9);
      piVar11 = (int *)CONCAT44(uStack_54,local_60._8_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_60._8_4_),1,0x10);
        }
      }
    }
    if (pQVar23 != (QNonContiguousByteDevice *)0x0) {
      pQVar3 = (this->super_QAbstractProtocolHandler).m_channel;
      QHttpNetworkReply::dataSendProgress
                ((QHttpNetworkReply *)(this->super_QAbstractProtocolHandler).m_reply,pQVar3->written
                 ,pQVar3->bytesTotal);
    }
LAB_00210f93:
    ((this->super_QAbstractProtocolHandler).m_channel)->state = WaitingState;
  }
  else {
    if (CVar2 != IdleState) goto LAB_00211394;
    bVar12 = QHttpNetworkConnectionChannel::ensureConnection
                       ((QHttpNetworkConnectionChannel *)pQVar3);
    if (!bVar12) goto LAB_00211392;
    bVar12 = QHttpNetworkRequest::isPreConnect
                       (&((this->super_QAbstractProtocolHandler).m_channel)->request);
    pQVar3 = (this->super_QAbstractProtocolHandler).m_channel;
    if (bVar12) {
      pQVar3->state = IdleState;
      *(undefined4 *)(*(long *)&((this->super_QAbstractProtocolHandler).m_reply)->field_0x8 + 0xd0)
           = 4;
      QHttpNetworkConnectionChannel::allDone((QHttpNetworkConnectionChannel *)pQVar3);
      QHttpNetworkConnection::preConnectFinished
                ((QHttpNetworkConnection *)(this->super_QAbstractProtocolHandler).m_connection);
      (this->super_QAbstractProtocolHandler).m_reply = (QHttpNetworkReply *)0x0;
      goto LAB_00211394;
    }
    pQVar3->written = 0;
    pQVar3->bytesTotal = 0;
    this_00 = *(QHttpNetworkReplyPrivate **)
               &((this->super_QAbstractProtocolHandler).m_reply)->field_0x8;
    QHttpNetworkReplyPrivate::clear(this_00);
    pQVar5 = &((this->super_QAbstractProtocolHandler).m_connection)->super_QObject;
    if (pQVar5 == (QObject *)0x0) {
      pDVar22 = (Data *)0x0;
    }
    else {
      pDVar22 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar5);
    }
    pDVar6 = (this_00->connection).wp.d;
    (this_00->connection).wp.d = pDVar22;
    (this_00->connection).wp.value = pQVar5;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar6->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar6->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDVar6);
      }
    }
    pQVar3 = (this->super_QAbstractProtocolHandler).m_channel;
    if (pQVar3 == (QHttpNetworkConnectionChannel *)0x0) {
      pDVar22 = (Data *)0x0;
    }
    else {
      pDVar22 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar3->super_QObject);
    }
    pDVar6 = (this_00->connectionChannel).wp.d;
    (this_00->connectionChannel).wp.d = pDVar22;
    (this_00->connectionChannel).wp.value = &pQVar3->super_QObject;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar6->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar6->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDVar6);
      }
    }
    pQVar3 = (this->super_QAbstractProtocolHandler).m_channel;
    pQVar7 = (pQVar3->request).d.d.ptr;
    this_03 = &(pQVar3->request).d;
    if ((pQVar7 != (QHttpNetworkRequestPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar7->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1)) {
      QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(this_03);
    }
    this_00->autoDecompress = ((this_03->d).ptr)->autoDecompress;
    this_00->pipeliningUsed = false;
    QHttpNetworkRequest::url((QHttpNetworkRequest *)&local_78);
    QUrl::userInfo(local_60 + 8,(QHttpNetworkRequest *)&local_78,0);
    if (CONCAT44(uStack_44,local_48) == 0) {
      piVar11 = (int *)CONCAT44(uStack_54,local_60._8_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_60._8_4_),2,0x10);
        }
      }
      url_00 = &local_78;
LAB_002117ee:
      QUrl::~QUrl((QUrl *)url_00);
    }
    else {
      bVar13 = QHttpNetworkRequest::withCredentials
                         (&((this->super_QAbstractProtocolHandler).m_channel)->request);
      piVar11 = (int *)CONCAT44(uStack_54,local_60._8_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_60._8_4_),2,0x10);
        }
      }
      QUrl::~QUrl((QUrl *)&local_78);
      if (bVar13) {
        local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QHttpNetworkRequest::url((QHttpNetworkRequest *)local_60);
        this_04 = &((this->super_QAbstractProtocolHandler).m_channel)->authenticator;
        QUrl::userName(local_60 + 8,(QHttpNetworkRequest *)local_60,0x7f00000);
        QAuthenticator::user(&local_78,this_04);
        bVar15 = 1;
        bVar14 = 1;
        if (CONCAT44(uStack_44,local_48) == local_78.d.size) {
          QVar26.m_data._4_4_ = uStack_4c;
          QVar26.m_data._0_4_ = uStack_50;
          QVar26.m_size = CONCAT44(uStack_44,local_48);
          QVar28.m_data = local_78.d.ptr;
          QVar28.m_size = local_78.d.size;
          bVar14 = QtPrivate::equalStrings(QVar26,QVar28);
          bVar14 = bVar14 ^ 1;
        }
        if (bVar14 == 0) {
          QUrl::password(local_90,local_60,0x7f00000);
          if (local_80 == 0) {
            bVar13 = false;
            bVar15 = 0;
          }
          else {
            QUrl::password(&local_a8,local_60,0x7f00000);
            QAuthenticator::password(&local_c0,this_04);
            bVar13 = true;
            if (local_98 == local_c0.d.size) {
              QVar27.m_data = local_a0;
              QVar27.m_size = local_98;
              QVar29.m_data = local_c0.d.ptr;
              QVar29.m_size = local_c0.d.size;
              bVar15 = QtPrivate::equalStrings(QVar27,QVar29);
              bVar15 = bVar15 ^ 1;
            }
            else {
              bVar15 = 1;
            }
          }
        }
        else {
          bVar13 = false;
        }
        if (bVar13) {
          if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_a8 != (QArrayData *)0x0) {
            LOCK();
            (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_a8,2,0x10);
            }
          }
        }
        if ((bVar14 == 0) && ((QArrayData *)local_90[0].stream != (QArrayData *)0x0)) {
          LOCK();
          *(int *)local_90[0].stream = *(int *)local_90[0].stream + -1;
          UNLOCK();
          if (*(int *)local_90[0].stream == 0) {
            QArrayData::deallocate((QArrayData *)local_90[0].stream,2,0x10);
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
          UNLOCK();
          if (*(int *)local_78.d.d == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        piVar11 = (int *)CONCAT44(uStack_54,local_60._8_4_);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_60._8_4_),2,0x10);
          }
        }
        if (bVar15 != 0) {
          QUrl::userName((QString *)(local_60 + 8),local_60,0x7f00000);
          QAuthenticator::setUser(this_04,(QString *)(local_60 + 8));
          piVar11 = (int *)CONCAT44(uStack_54,local_60._8_4_);
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + -1;
            UNLOCK();
            if (*piVar11 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_60._8_4_),2,0x10);
            }
          }
          QUrl::password((QString *)(local_60 + 8),local_60,0x7f00000);
          QAuthenticator::setPassword(this_04,(QString *)(local_60 + 8));
          piVar11 = (int *)CONCAT44(uStack_54,local_60._8_4_);
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + -1;
            UNLOCK();
            if (*piVar11 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_60._8_4_),2,0x10);
            }
          }
          this_01 = *(QHttpNetworkConnectionPrivate **)
                     &((this->super_QAbstractProtocolHandler).m_connection)->field_0x8;
          iVar16 = QHttpNetworkConnectionPrivate::indexOf
                             (this_01,(this->super_QAbstractProtocolHandler).m_socket);
          QHttpNetworkConnectionPrivate::copyCredentials(this_01,iVar16,this_04,false);
        }
        local_60._8_4_ = 0;
        uStack_54 = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        local_48 = 0;
        uStack_44 = 0;
        QUrl::setUserInfo((QString *)local_60,(int)local_60 + 8);
        piVar11 = (int *)CONCAT44(uStack_54,local_60._8_4_);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_60._8_4_),2,0x10);
          }
        }
        url_00 = (QString *)local_60;
        QHttpNetworkRequest::setUrl
                  (&((this->super_QAbstractProtocolHandler).m_channel)->request,(QUrl *)url_00);
        goto LAB_002117ee;
      }
    }
    bVar13 = QHttpNetworkRequest::withCredentials
                       (&((this->super_QAbstractProtocolHandler).m_channel)->request);
    if (bVar13) {
      QHttpNetworkConnectionPrivate::createAuthorization
                (*(QHttpNetworkConnectionPrivate **)
                  &((this->super_QAbstractProtocolHandler).m_connection)->field_0x8,
                 (this->super_QAbstractProtocolHandler).m_socket,
                 &((this->super_QAbstractProtocolHandler).m_channel)->request);
    }
    pQVar3 = (this->super_QAbstractProtocolHandler).m_channel;
    PVar17 = QNetworkProxy::type((QNetworkProxy *)
                                 (*(long *)&((this->super_QAbstractProtocolHandler).m_connection)->
                                            field_0x8 + 0xc0));
    QHttpNetworkRequestPrivate::header
              ((QByteArray *)(local_60 + 8),&pQVar3->request,PVar17 != NoProxy);
    pQVar25 = &((this->m_header).d.d)->super_QArrayData;
    pcVar20 = (this->m_header).d.ptr;
    pDVar10 = (Data *)CONCAT44(uStack_54,local_60._8_4_);
    local_60._8_4_ = SUB84(pQVar25,0);
    uStack_54 = (undefined4)((ulong)pQVar25 >> 0x20);
    (this->m_header).d.d = pDVar10;
    (this->m_header).d.ptr = (char *)CONCAT44(uStack_4c,uStack_50);
    uStack_50 = SUB84(pcVar20,0);
    uStack_4c = (undefined4)((ulong)pcVar20 >> 0x20);
    qVar8 = (this->m_header).d.size;
    (this->m_header).d.size = CONCAT44(uStack_44,local_48);
    local_48 = (undefined4)qVar8;
    uStack_44 = (undefined4)((ulong)qVar8 >> 0x20);
    if (pQVar25 != (QArrayData *)0x0) {
      LOCK();
      (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar25->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar25->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar25,1,0x10);
      }
    }
    pQVar23 = QHttpNetworkRequest::uploadByteDevice
                        (&((this->super_QAbstractProtocolHandler).m_channel)->request);
    if (pQVar23 == (QNonContiguousByteDevice *)0x0) {
      pQVar9 = (this->super_QAbstractProtocolHandler).m_socket;
      pDVar10 = (this->m_header).d.d;
      pcVar20 = (this->m_header).d.ptr;
      (this->m_header).d.d = (Data *)0x0;
      (this->m_header).d.ptr = (char *)0x0;
      local_60._8_4_ = SUB84(pDVar10,0);
      uStack_54 = (undefined4)((ulong)pDVar10 >> 0x20);
      uStack_50 = SUB84(pcVar20,0);
      uStack_4c = (undefined4)((ulong)pcVar20 >> 0x20);
      qVar8 = (this->m_header).d.size;
      (this->m_header).d.size = 0;
      local_48 = (undefined4)qVar8;
      uStack_44 = (undefined4)((ulong)qVar8 >> 0x20);
      (this->m_header).d.size = 0;
      (this->m_header).d.d = (Data *)0x0;
      (this->m_header).d.ptr = (char *)0x0;
      QIODevice::write((QByteArray *)pQVar9);
      piVar11 = (int *)CONCAT44(uStack_54,local_60._8_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_60._8_4_),1,0x10);
        }
      }
      local_60._8_4_ = 0;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_48 = 0;
      uStack_44 = 0;
      QMetaObject::invokeMethodImpl
                (&((this->super_QAbstractProtocolHandler).m_reply)->super_QObject,"requestSent",
                 QueuedConnection,1,(void **)(local_60 + 8),(char **)&uStack_50,
                 (QMetaTypeInterface **)&local_48);
      goto LAB_00210f93;
    }
    QObject::connect(local_c8,(char *)pQVar23,(QObject *)"2readyRead()",
                     (char *)(this->super_QAbstractProtocolHandler).m_channel,0x26eec7);
    QMetaObject::Connection::~Connection((Connection *)local_c8);
    qVar24 = QHttpNetworkRequest::contentLength
                       (&((this->super_QAbstractProtocolHandler).m_channel)->request);
    pQVar3 = (this->super_QAbstractProtocolHandler).m_channel;
    pQVar3->bytesTotal = qVar24;
    pQVar3->state = WritingState;
  }
  bVar13 = true;
  (*(this->super_QAbstractProtocolHandler)._vptr_QAbstractProtocolHandler[4])(this);
LAB_00211394:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar13;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpProtocolHandler::sendRequest()
{
    m_reply = m_channel->reply;

    if (!m_reply) {
        // heh, how should that happen!
        qWarning("QAbstractProtocolHandler::sendRequest() called without QHttpNetworkReply");
        return false;
    }

    switch (m_channel->state) {
    case QHttpNetworkConnectionChannel::IdleState: { // write the header
        if (!m_channel->ensureConnection()) {
            // wait for the connection (and encryption) to be done
            // sendRequest will be called again from either
            // _q_connected or _q_encrypted
            return false;
        }
        if (m_channel->request.isPreConnect()) {
            m_channel->state = QHttpNetworkConnectionChannel::IdleState;
            m_reply->d_func()->state = QHttpNetworkReplyPrivate::AllDoneState;
            m_channel->allDone();
            m_connection->preConnectFinished(); // will only decrease the counter
            m_reply = nullptr; // so we can reuse this channel
            return true; // we have a working connection and are done
        }

        m_channel->written = 0; // excluding the header
        m_channel->bytesTotal = 0;

        QHttpNetworkReplyPrivate *replyPrivate = m_reply->d_func();
        replyPrivate->clear();
        replyPrivate->connection = m_connection;
        replyPrivate->connectionChannel = m_channel;
        replyPrivate->autoDecompress = m_channel->request.d->autoDecompress;
        replyPrivate->pipeliningUsed = false;

        // if the url contains authentication parameters, use the new ones
        // both channels will use the new authentication parameters
        if (!m_channel->request.url().userInfo().isEmpty() && m_channel->request.withCredentials()) {
            QUrl url = m_channel->request.url();
            QAuthenticator &auth = m_channel->authenticator;
            if (url.userName() != auth.user()
                || (!url.password().isEmpty() && url.password() != auth.password())) {
                auth.setUser(url.userName());
                auth.setPassword(url.password());
                m_connection->d_func()->copyCredentials(m_connection->d_func()->indexOf(m_socket), &auth, false);
            }
            // clear the userinfo,  since we use the same request for resending
            // userinfo in url can conflict with the one in the authenticator
            url.setUserInfo(QString());
            m_channel->request.setUrl(url);
        }
        // Will only be false if Qt WebKit is performing a cross-origin XMLHttpRequest
        // and withCredentials has not been set to true.
        if (m_channel->request.withCredentials())
            m_connection->d_func()->createAuthorization(m_socket, m_channel->request);
#ifndef QT_NO_NETWORKPROXY
        m_header = QHttpNetworkRequestPrivate::header(m_channel->request,
            (m_connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy));
#else
        m_header = QHttpNetworkRequestPrivate::header(m_channel->request, false);
#endif

        // flushing is dangerous (QSslSocket calls transmit which might read or error)
//        m_socket->flush();
        QNonContiguousByteDevice* uploadByteDevice = m_channel->request.uploadByteDevice();
        if (uploadByteDevice) {
            // connect the signals so this function gets called again
            QObject::connect(uploadByteDevice, SIGNAL(readyRead()), m_channel, SLOT(_q_uploadDataReadyRead()));

            m_channel->bytesTotal = m_channel->request.contentLength();

            m_channel->state = QHttpNetworkConnectionChannel::WritingState; // start writing data
            sendRequest(); //recurse
        } else {
            // no data to send: just send the HTTP headers
            m_socket->write(std::exchange(m_header, {}));
            QMetaObject::invokeMethod(m_reply, "requestSent", Qt::QueuedConnection);
            m_channel->state = QHttpNetworkConnectionChannel::WaitingState; // now wait for response
            sendRequest(); //recurse
        }

        break;
    }
    case QHttpNetworkConnectionChannel::WritingState:
    {
        // write the data
        QNonContiguousByteDevice* uploadByteDevice = m_channel->request.uploadByteDevice();
        if (!uploadByteDevice || m_channel->bytesTotal == m_channel->written) {
            // the upload device might have no data to send, but we still have to send the headers,
            // do it now.
            if (!m_header.isEmpty())
                m_socket->write(std::exchange(m_header, {}));
            if (uploadByteDevice)
                emit m_reply->dataSendProgress(m_channel->written, m_channel->bytesTotal);
            m_channel->state = QHttpNetworkConnectionChannel::WaitingState; // now wait for response
            sendRequest(); // recurse
            break;
        }

        // only feed the QTcpSocket buffer when there is less than 32 kB in it;
        // note that the headers do not count towards these limits.
        const qint64 socketBufferFill = 32*1024;
        const qint64 socketWriteMaxSize = 16*1024;

        // if it is really an ssl socket, check more than just bytesToWrite()
#ifndef QT_NO_SSL
        QSslSocket *sslSocket = qobject_cast<QSslSocket*>(m_socket);
        const auto encryptedBytesToWrite = [sslSocket]() -> qint64
        {
            return sslSocket ? sslSocket->encryptedBytesToWrite() : 0;
        };
#else
        const auto encryptedBytesToWrite = [](){ return qint64(0); };
#endif

        // throughout this loop, we want to send the data coming from uploadByteDevice.
        // we also need to send the headers, as we try to coalesce their write with the data.
        // we won't send more than the limits above, excluding the headers
        while ((m_socket->bytesToWrite() + encryptedBytesToWrite()) <= socketBufferFill
               && m_channel->bytesTotal != m_channel->written)
        {
            // get pointer to upload data
            qint64 currentReadSize = 0;
            const qint64 desiredReadSize = qMin(socketWriteMaxSize, m_channel->bytesTotal - m_channel->written);
            const char *readPointer = uploadByteDevice->readPointer(desiredReadSize, currentReadSize);

            if (currentReadSize == -1) {
                // premature eof happened
                m_connection->d_func()->emitReplyError(m_socket, m_reply, QNetworkReply::UnknownNetworkError);
                return false;
            } else if (readPointer == nullptr || currentReadSize == 0) {
                // nothing to read currently, break the loop
                break;
            } else {
                if (m_channel->written != uploadByteDevice->pos()) {
                    // Sanity check. This was useful in tracking down an upload corruption.
                    qWarning() << "QHttpProtocolHandler: Internal error in sendRequest. Expected to write at position" << m_channel->written << "but read device is at" << uploadByteDevice->pos();
                    Q_ASSERT(m_channel->written == uploadByteDevice->pos());
                    m_connection->d_func()->emitReplyError(m_socket, m_reply, QNetworkReply::ProtocolFailure);
                    return false;
                }
                qint64 currentWriteSize;
                if (m_header.isEmpty()) {
                    currentWriteSize = m_socket->write(readPointer, currentReadSize);
                } else {
                    // assemble header and data and send them together
                    const qint64 headerSize = m_header.size();
                    m_header.append(readPointer, currentReadSize);
                    currentWriteSize = m_socket->write(std::exchange(m_header, {}));
                    if (currentWriteSize != -1)
                        currentWriteSize -= headerSize;
                    QMetaObject::invokeMethod(m_reply, "requestSent", Qt::QueuedConnection);
                }
                if (currentWriteSize == -1 || currentWriteSize != currentReadSize) {
                    // socket broke down
                    m_connection->d_func()->emitReplyError(m_socket, m_reply, QNetworkReply::UnknownNetworkError);
                    return false;
                } else {
                    m_channel->written += currentWriteSize;
                    uploadByteDevice->advanceReadPointer(currentWriteSize);

                    emit m_reply->dataSendProgress(m_channel->written, m_channel->bytesTotal);

                    if (m_channel->written == m_channel->bytesTotal) {
                        // make sure this function is called once again
                        m_channel->state = QHttpNetworkConnectionChannel::WaitingState;
                        sendRequest();
                        break;
                    }
                }
            }
        }
        break;
    }

    case QHttpNetworkConnectionChannel::WaitingState:
    {
        QNonContiguousByteDevice* uploadByteDevice = m_channel->request.uploadByteDevice();
        if (uploadByteDevice) {
            QObject::disconnect(uploadByteDevice, SIGNAL(readyRead()), m_channel, SLOT(_q_uploadDataReadyRead()));
        }

        // HTTP pipelining
        //m_connection->d_func()->fillPipeline(m_socket);
        //m_socket->flush();

        // ensure we try to receive a reply in all cases, even if _q_readyRead_ hat not been called
        // this is needed if the sends an reply before we have finished sending the request. In that
        // case receiveReply had been called before but ignored the server reply
        if (m_socket->bytesAvailable())
            QMetaObject::invokeMethod(m_channel, "_q_receiveReply", Qt::QueuedConnection);
        break;
    }
    case QHttpNetworkConnectionChannel::ReadingState:
        // ignore _q_bytesWritten in these states
        Q_FALLTHROUGH();
    default:
        break;
    }
    return true;
}